

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

FromBase64Result *
QByteArray::fromBase64Encoding
          (FromBase64Result *__return_storage_ptr__,QByteArray *base64,Base64Options options)

{
  qsizetype inputSize;
  char *output;
  char *input;
  long in_FS_OFFSET;
  fromBase64_helper_result fVar1;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  inputSize = (base64->d).size;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray(&local_48,(ulong)(inputSize * 3) >> 2,Uninitialized);
  input = (base64->d).ptr;
  if (input == (char *)0x0) {
    input = &_empty;
  }
  output = local_48.d.ptr;
  if (local_48.d.ptr == (char *)0x0) {
    output = &_empty;
  }
  fVar1 = anon_unknown.dwarf_bd45c8::fromBase64_helper(input,inputSize,output,options);
  if (fVar1.decodedLength < local_48.d.size) {
    resize(&local_48,fVar1.decodedLength);
  }
  *(undefined4 *)&(__return_storage_ptr__->decoded).d.d = local_48.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->decoded).d.d + 4) = local_48.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->decoded).d.ptr = local_48.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->decoded).d.ptr + 4) = local_48.d.ptr._4_4_;
  (__return_storage_ptr__->decoded).d.size = local_48.d.size;
  __return_storage_ptr__->decodingStatus = fVar1.status;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::FromBase64Result QByteArray::fromBase64Encoding(const QByteArray &base64, Base64Options options)
{
    const auto base64Size = base64.size();
    QByteArray result((base64Size * 3) / 4, Qt::Uninitialized);
    const auto base64result = fromBase64_helper(base64.data(),
                                                base64Size,
                                                const_cast<char *>(result.constData()),
                                                options);
    result.truncate(base64result.decodedLength);
    return { std::move(result), base64result.status };
}